

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O2

int stats_mutexes_reset_ctl
              (tsd_t *tsd,size_t *mib,size_t miblen,void *oldp,size_t *oldlenp,void *newp,
              size_t newlen)

{
  long lVar1;
  void *pvVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  uint j;
  ulong uVar7;
  long lVar8;
  malloc_mutex_t *mutex;
  
  malloc_mutex_lock((tsdn_t *)tsd,&ctl_mtx);
  malloc_mutex_prof_data_reset((tsdn_t *)tsd,&ctl_mtx);
  ctl_mtx.field_0.field_0.locked.repr = (atomic_b_t)false;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&ctl_mtx.field_0 + 0x40));
  malloc_mutex_lock((tsdn_t *)tsd,&background_thread_lock);
  malloc_mutex_prof_data_reset((tsdn_t *)tsd,&background_thread_lock);
  background_thread_lock.field_0.field_0.locked.repr = (atomic_b_t)false;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&background_thread_lock.field_0 + 0x40));
  uVar4 = narenas_total_get();
  for (uVar5 = 0; uVar5 != uVar4; uVar5 = uVar5 + 1) {
    pvVar2 = arenas[uVar5].repr;
    if (pvVar2 != (void *)0x0) {
      malloc_mutex_lock((tsdn_t *)tsd,(malloc_mutex_t *)((long)pvVar2 + 0x2878));
      malloc_mutex_prof_data_reset((tsdn_t *)tsd,(malloc_mutex_t *)((long)pvVar2 + 0x2878));
      *(undefined1 *)((long)pvVar2 + 0x28e0) = 0;
      pthread_mutex_unlock((pthread_mutex_t *)((long)pvVar2 + 0x28b8));
      malloc_mutex_lock((tsdn_t *)tsd,(malloc_mutex_t *)((long)pvVar2 + 0x7198));
      malloc_mutex_prof_data_reset((tsdn_t *)tsd,(malloc_mutex_t *)((long)pvVar2 + 0x7198));
      *(undefined1 *)((long)pvVar2 + 0x7200) = 0;
      pthread_mutex_unlock((pthread_mutex_t *)((long)pvVar2 + 0x71d8));
      malloc_mutex_lock((tsdn_t *)tsd,(malloc_mutex_t *)((long)pvVar2 + 0x28e8));
      malloc_mutex_prof_data_reset((tsdn_t *)tsd,(malloc_mutex_t *)((long)pvVar2 + 0x28e8));
      *(undefined1 *)((long)pvVar2 + 0x2950) = 0;
      pthread_mutex_unlock((pthread_mutex_t *)((long)pvVar2 + 0x2928));
      malloc_mutex_lock((tsdn_t *)tsd,(malloc_mutex_t *)((long)pvVar2 + 0x3c50));
      malloc_mutex_prof_data_reset((tsdn_t *)tsd,(malloc_mutex_t *)((long)pvVar2 + 0x3c50));
      *(undefined1 *)((long)pvVar2 + 0x3cb8) = 0;
      pthread_mutex_unlock((pthread_mutex_t *)((long)pvVar2 + 0x3c90));
      malloc_mutex_lock((tsdn_t *)tsd,(malloc_mutex_t *)((long)pvVar2 + 0x4fb8));
      malloc_mutex_prof_data_reset((tsdn_t *)tsd,(malloc_mutex_t *)((long)pvVar2 + 0x4fb8));
      *(undefined1 *)((long)pvVar2 + 0x5020) = 0;
      pthread_mutex_unlock((pthread_mutex_t *)((long)pvVar2 + 0x4ff8));
      malloc_mutex_lock((tsdn_t *)tsd,(malloc_mutex_t *)((long)pvVar2 + 0x6320));
      malloc_mutex_prof_data_reset((tsdn_t *)tsd,(malloc_mutex_t *)((long)pvVar2 + 0x6320));
      *(undefined1 *)((long)pvVar2 + 0x6388) = 0;
      pthread_mutex_unlock((pthread_mutex_t *)((long)pvVar2 + 0x6360));
      malloc_mutex_lock((tsdn_t *)tsd,(malloc_mutex_t *)((long)pvVar2 + 0x6a18));
      malloc_mutex_prof_data_reset((tsdn_t *)tsd,(malloc_mutex_t *)((long)pvVar2 + 0x6a18));
      *(undefined1 *)((long)pvVar2 + 0x6a80) = 0;
      pthread_mutex_unlock((pthread_mutex_t *)((long)pvVar2 + 0x6a58));
      malloc_mutex_lock((tsdn_t *)tsd,(malloc_mutex_t *)((long)pvVar2 + 0x27d0));
      malloc_mutex_prof_data_reset((tsdn_t *)tsd,(malloc_mutex_t *)((long)pvVar2 + 0x27d0));
      *(undefined1 *)((long)pvVar2 + 0x2838) = 0;
      pthread_mutex_unlock((pthread_mutex_t *)((long)pvVar2 + 0x2810));
      malloc_mutex_lock((tsdn_t *)tsd,(malloc_mutex_t *)(*(long *)((long)pvVar2 + 0x7328) + 0x10));
      malloc_mutex_prof_data_reset
                ((tsdn_t *)tsd,(malloc_mutex_t *)(*(long *)((long)pvVar2 + 0x7328) + 0x10));
      lVar6 = *(long *)((long)pvVar2 + 0x7328);
      *(undefined1 *)(lVar6 + 0x78) = 0;
      pthread_mutex_unlock((pthread_mutex_t *)(lVar6 + 0x50));
      for (lVar6 = 0; lVar6 != 0x24; lVar6 = lVar6 + 1) {
        lVar8 = 0x40;
        for (uVar7 = 0; uVar7 < bin_infos[lVar6].n_shards; uVar7 = uVar7 + 1) {
          lVar3 = *(long *)((long)pvVar2 + lVar6 * 8 + 0x7208);
          lVar1 = lVar3 + lVar8;
          mutex = (malloc_mutex_t *)(lVar1 + -0x40);
          malloc_mutex_lock((tsdn_t *)tsd,mutex);
          malloc_mutex_prof_data_reset((tsdn_t *)tsd,mutex);
          *(undefined1 *)(lVar1 + 0x28) = 0;
          pthread_mutex_unlock((pthread_mutex_t *)(lVar3 + lVar8));
          lVar8 = lVar8 + 0x118;
        }
      }
    }
  }
  return 0;
}

Assistant:

static int
stats_mutexes_reset_ctl(tsd_t *tsd, const size_t *mib,
    size_t miblen, void *oldp, size_t *oldlenp,
    void *newp, size_t newlen) {
	if (!config_stats) {
		return ENOENT;
	}

	tsdn_t *tsdn = tsd_tsdn(tsd);

#define MUTEX_PROF_RESET(mtx)						\
    malloc_mutex_lock(tsdn, &mtx);					\
    malloc_mutex_prof_data_reset(tsdn, &mtx);				\
    malloc_mutex_unlock(tsdn, &mtx);

	/* Global mutexes: ctl and prof. */
	MUTEX_PROF_RESET(ctl_mtx);
	if (have_background_thread) {
		MUTEX_PROF_RESET(background_thread_lock);
	}
	if (config_prof && opt_prof) {
		MUTEX_PROF_RESET(bt2gctx_mtx);
	}


	/* Per arena mutexes. */
	unsigned n = narenas_total_get();

	for (unsigned i = 0; i < n; i++) {
		arena_t *arena = arena_get(tsdn, i, false);
		if (!arena) {
			continue;
		}
		MUTEX_PROF_RESET(arena->large_mtx);
		MUTEX_PROF_RESET(arena->extent_avail_mtx);
		MUTEX_PROF_RESET(arena->extents_dirty.mtx);
		MUTEX_PROF_RESET(arena->extents_muzzy.mtx);
		MUTEX_PROF_RESET(arena->extents_retained.mtx);
		MUTEX_PROF_RESET(arena->decay_dirty.mtx);
		MUTEX_PROF_RESET(arena->decay_muzzy.mtx);
		MUTEX_PROF_RESET(arena->tcache_ql_mtx);
		MUTEX_PROF_RESET(arena->base->mtx);

		for (szind_t i = 0; i < SC_NBINS; i++) {
			for (unsigned j = 0; j < bin_infos[i].n_shards; j++) {
				bin_t *bin = &arena->bins[i].bin_shards[j];
				MUTEX_PROF_RESET(bin->lock);
			}
		}
	}
#undef MUTEX_PROF_RESET
	return 0;
}